

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-bmp.cxx
# Opt level: O2

void testSaveLoad<(andres::CoordinateOrder)0,(andres::CoordinateOrder)0>(void)

{
  reference puVar1;
  allocator_type local_8e;
  uchar local_8d;
  CoordinateOrder local_8c;
  size_t shape [2];
  unsigned_long local_78;
  string fileName;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  
  shape[0] = 2;
  shape[1] = 3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileName,"test.bmp",(allocator<char> *)&m);
  local_8d = '\0';
  local_8c = FirstMajorOrder;
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)&m,shape,&local_78,&local_8d,
             &local_8c,&local_8e);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,0,0);
  *puVar1 = '\x7f';
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,0,2);
  *puVar1 = 0xff;
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&m,1,0);
  *puVar1 = 200;
  andres::bmp::save<unsigned_char>(&fileName,&m);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::__cxx11::string::~string((string *)&fileName);
  return;
}

Assistant:

void testSaveLoad() {
    size_t const shape[] = {2, 3};
    std::string const fileName = "test.bmp";
    {
        andres::Marray<unsigned char> m(shape, shape + 2, 0, ORDER_SAVE);
        m(0, 0) = 127;
        m(0, 2) = 255;
        m(1, 0) = 200;
        andres::bmp::save(fileName, m);
    }
    /*
    {
        andres::Marray<unsigned char> m(0, ORDER_LOAD);
        andres::png::load(fileName, m);
        test(m.coordinateOrder() == ORDER_LOAD);
        test(m.dimension() == 2);
        test(m.shape(0) == shape[0]);
        test(m.shape(1) == shape[1]);
        test(m(0, 0) == 127);
        test(m(0, 2) == 255);
        test(m(1, 0) == 200);
    }
    */
}